

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

b_str<char> *
detail::operator|(b_str<char> *__return_storage_ptr__,b_str<char> *str,
                 split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 *info)

{
  pointer pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  
  uVar3 = std::__cxx11::string::find_first_of((char *)str,(ulong)(info->delim)._M_dataplus._M_p,0);
  if (uVar3 == 0xffffffffffffffff) {
    paVar4 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
    psVar5 = &__return_storage_ptr__->_M_string_length;
  }
  else {
    std::__cxx11::string::find_first_not_of((char *)str,(ulong)(info->delim)._M_dataplus._M_p,uVar3)
    ;
    std::__cxx11::string::erase((ulong)str,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    paVar4 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    psVar5 = &str->_M_string_length;
    __return_storage_ptr__->_M_string_length = str->_M_string_length;
    (str->_M_dataplus)._M_p = (pointer)paVar4;
  }
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}